

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test
::TestBody(SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *this)

{
  TypedExpectation<int_(SDL_Event_&)> *pTVar1;
  SDLEventsSource *this_00;
  char *message;
  undefined1 local_a0 [32];
  MatcherBase<SDL_Event_&> local_80;
  undefined1 local_68 [16];
  code *local_58;
  code *local_50;
  AssertionResult gtest_ar;
  
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f52c8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_a0,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_80
            );
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_a0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x2e,"*sdlMock","pollEvent(_)");
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
             ::_M_manager;
  local_50 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
             ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar1,(Action<int_(SDL_Event_&)> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_a0 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_80);
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f52c8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_a0,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_80
            );
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_a0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x34,"*sdlMock","pollEvent(_)");
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
             ::_M_manager;
  local_50 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
             ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar1,(Action<int_(SDL_Event_&)> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_a0 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_80);
  local_68._8_8_ =
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_68._0_8_ = &PTR__MatcherBase_002f52c8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)&gtest_ar,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)local_68)
  ;
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x3a,"*sdlMock","pollEvent(_)");
  testing::internal::ReturnAction<int>::ReturnAction((ReturnAction<int> *)&local_80,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(SDL_Event_&)> *)local_a0,(ReturnAction *)&local_80);
  this_00 = (SDLEventsSource *)local_a0;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar1,(Action<int_(SDL_Event_&)> *)this_00);
  std::_Function_base::~_Function_base((_Function_base *)local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80.vtable_);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)&gtest_ar.message_);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase((MatcherBase<SDL_Event_&> *)local_68);
  local_a0._0_8_ =
       SDLEventsSource::getEvent((Event *)&(this->super_SDLEventsSourceTests).eventsSource,this_00);
  std::
  get<0ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
            ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              *)local_a0);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((FunctionMocker<int_(SDL_Event_&)> *)local_a0._0_8_ !=
        (FunctionMocker<int_(SDL_Event_&)> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Return(0));
    EXPECT_EQ(std::get<NoEvents>(eventsSource.getEvent()), NoEvents {});
}